

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O1

bool cmScanDepFormat_P1689_Write(string *path,cmScanDepInfo *info)

{
  byte bVar1;
  int iVar2;
  pointer pbVar3;
  pointer pcVar4;
  pointer pcVar5;
  bool bVar6;
  string *psVar7;
  Value *pVVar8;
  Value *pVVar9;
  char *value;
  string *psVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  pointer path_00;
  Value rule;
  Value ddi;
  Value encoded;
  cmGeneratedFileStream ddif;
  Value local_348;
  Value *local_320;
  string *local_318;
  Value local_310;
  Value local_2e8;
  Value local_2c0;
  ValueHolder local_298 [4];
  byte abStack_278 [584];
  
  local_318 = path;
  Json::Value::Value(&local_2e8,objectValue);
  Json::Value::Value((Value *)local_298,0);
  pVVar8 = Json::Value::operator[](&local_2e8,"version");
  Json::Value::operator=(pVVar8,(Value *)local_298);
  Json::Value::~Value((Value *)local_298);
  Json::Value::Value((Value *)local_298,0);
  pVVar8 = Json::Value::operator[](&local_2e8,"revision");
  Json::Value::operator=(pVVar8,(Value *)local_298);
  Json::Value::~Value((Value *)local_298);
  Json::Value::Value((Value *)local_298,arrayValue);
  pVVar8 = Json::Value::operator[](&local_2e8,"rules");
  local_320 = Json::Value::operator=(pVVar8,(Value *)local_298);
  Json::Value::~Value((Value *)local_298);
  Json::Value::Value(&local_310,objectValue);
  EncodeFilename((Value *)local_298,&info->PrimaryOutput);
  pVVar8 = Json::Value::operator[](&local_310,"primary-output");
  Json::Value::operator=(pVVar8,(Value *)local_298);
  Json::Value::~Value((Value *)local_298);
  Json::Value::Value((Value *)local_298,arrayValue);
  pVVar8 = Json::Value::operator[](&local_310,"outputs");
  pVVar8 = Json::Value::operator=(pVVar8,(Value *)local_298);
  Json::Value::~Value((Value *)local_298);
  path_00 = (info->ExtraOutputs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (info->ExtraOutputs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (path_00 != pbVar3) {
    do {
      EncodeFilename((Value *)local_298,path_00);
      Json::Value::append(pVVar8,(Value *)local_298);
      Json::Value::~Value((Value *)local_298);
      path_00 = path_00 + 1;
    } while (path_00 != pbVar3);
  }
  Json::Value::Value((Value *)local_298,arrayValue);
  pVVar8 = Json::Value::operator[](&local_310,"provides");
  pVVar8 = Json::Value::operator=(pVVar8,(Value *)local_298);
  Json::Value::~Value((Value *)local_298);
  pcVar4 = (info->Provides).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pcVar5 = (info->Provides).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pcVar4 != pcVar5) {
    psVar10 = &pcVar4->SourcePath;
    do {
      Json::Value::Value((Value *)local_298,objectValue);
      EncodeFilename(&local_2c0,psVar10 + -1);
      pVVar9 = Json::Value::operator[]((Value *)local_298,"logical-name");
      Json::Value::operator=(pVVar9,&local_2c0);
      if (psVar10[1]._M_string_length != 0) {
        EncodeFilename(&local_348,psVar10 + 1);
        pVVar9 = Json::Value::operator[]((Value *)local_298,"compiled-module-path");
        Json::Value::operator=(pVVar9,&local_348);
        Json::Value::~Value(&local_348);
      }
      if (*(char *)&psVar10[2]._M_dataplus._M_p == '\x01') {
        Json::Value::Value(&local_348,true);
        pVVar9 = Json::Value::operator[]((Value *)local_298,"unique-on-source-path");
        Json::Value::operator=(pVVar9,&local_348);
        Json::Value::~Value(&local_348);
        EncodeFilename(&local_348,psVar10);
        pVVar9 = Json::Value::operator[]((Value *)local_298,"source-path");
LAB_006abb04:
        Json::Value::operator=(pVVar9,&local_348);
        Json::Value::~Value(&local_348);
      }
      else if (psVar10->_M_string_length != 0) {
        EncodeFilename(&local_348,psVar10);
        pVVar9 = Json::Value::operator[]((Value *)local_298,"source-path");
        goto LAB_006abb04;
      }
      Json::Value::Value(&local_348,*(bool *)((long)&psVar10[2]._M_dataplus._M_p + 1));
      pVVar9 = Json::Value::operator[]((Value *)local_298,"is-interface");
      Json::Value::operator=(pVVar9,&local_348);
      Json::Value::~Value(&local_348);
      Json::Value::append(pVVar8,(Value *)local_298);
      Json::Value::~Value(&local_2c0);
      Json::Value::~Value((Value *)local_298);
      psVar7 = psVar10 + 2;
      psVar10 = (string *)&psVar10[3]._M_string_length;
    } while ((pointer)&psVar7->_M_string_length != pcVar5);
  }
  Json::Value::Value((Value *)local_298,arrayValue);
  pVVar8 = Json::Value::operator[](&local_310,"requires");
  pVVar8 = Json::Value::operator=(pVVar8,(Value *)local_298);
  Json::Value::~Value((Value *)local_298);
  pcVar4 = (info->Requires).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pcVar5 = (info->Requires).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pcVar4 != pcVar5) {
    psVar10 = &pcVar4->SourcePath;
    do {
      Json::Value::Value((Value *)local_298,objectValue);
      EncodeFilename(&local_2c0,psVar10 + -1);
      pVVar9 = Json::Value::operator[]((Value *)local_298,"logical-name");
      Json::Value::operator=(pVVar9,&local_2c0);
      if (psVar10[1]._M_string_length != 0) {
        EncodeFilename(&local_348,psVar10 + 1);
        pVVar9 = Json::Value::operator[]((Value *)local_298,"compiled-module-path");
        Json::Value::operator=(pVVar9,&local_348);
        Json::Value::~Value(&local_348);
      }
      if (*(char *)&psVar10[2]._M_dataplus._M_p == '\x01') {
        Json::Value::Value(&local_348,true);
        pVVar9 = Json::Value::operator[]((Value *)local_298,"unique-on-source-path");
        Json::Value::operator=(pVVar9,&local_348);
        Json::Value::~Value(&local_348);
        EncodeFilename(&local_348,psVar10);
        pVVar9 = Json::Value::operator[]((Value *)local_298,"source-path");
LAB_006abcc1:
        Json::Value::operator=(pVVar9,&local_348);
        Json::Value::~Value(&local_348);
      }
      else if (psVar10->_M_string_length != 0) {
        EncodeFilename(&local_348,psVar10);
        pVVar9 = Json::Value::operator[]((Value *)local_298,"source-path");
        goto LAB_006abcc1;
      }
      iVar2 = *(int *)((long)&psVar10[2]._M_dataplus._M_p + 4);
      if (iVar2 == 2) {
        bVar6 = false;
        value = "include-quote";
      }
      else if (iVar2 == 1) {
        bVar6 = false;
        value = "include-angle";
      }
      else {
        bVar6 = true;
        value = (char *)0x0;
      }
      if (!bVar6) {
        Json::Value::Value(&local_348,value);
        pVVar9 = Json::Value::operator[]((Value *)local_298,"lookup-method");
        Json::Value::operator=(pVVar9,&local_348);
        Json::Value::~Value(&local_348);
      }
      Json::Value::append(pVVar8,(Value *)local_298);
      Json::Value::~Value(&local_2c0);
      Json::Value::~Value((Value *)local_298);
      psVar7 = psVar10 + 2;
      psVar10 = (string *)&psVar10[3]._M_string_length;
    } while ((pointer)&psVar7->_M_string_length != pcVar5);
  }
  Json::Value::append(local_320,&local_310);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,local_318,false,None);
  Json::operator<<((OStream *)local_298,&local_2e8);
  bVar1 = abStack_278[*(long *)(local_298[0].int_ + -0x18)];
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  Json::Value::~Value(&local_310);
  Json::Value::~Value(&local_2e8);
  return (bVar1 & 5) == 0;
}

Assistant:

bool cmScanDepFormat_P1689_Write(std::string const& path,
                                 cmScanDepInfo const& info)
{
  Json::Value ddi(Json::objectValue);
  ddi["version"] = 0;
  ddi["revision"] = 0;

  Json::Value& rules = ddi["rules"] = Json::arrayValue;

  Json::Value rule(Json::objectValue);

  rule["primary-output"] = EncodeFilename(info.PrimaryOutput);

  Json::Value& rule_outputs = rule["outputs"] = Json::arrayValue;
  for (auto const& output : info.ExtraOutputs) {
    rule_outputs.append(EncodeFilename(output));
  }

  Json::Value& provides = rule["provides"] = Json::arrayValue;
  for (auto const& provide : info.Provides) {
    Json::Value provide_obj(Json::objectValue);
    auto const encoded = EncodeFilename(provide.LogicalName);
    provide_obj["logical-name"] = encoded;
    if (!provide.CompiledModulePath.empty()) {
      provide_obj["compiled-module-path"] =
        EncodeFilename(provide.CompiledModulePath);
    }

    if (provide.UseSourcePath) {
      provide_obj["unique-on-source-path"] = true;
      provide_obj["source-path"] = EncodeFilename(provide.SourcePath);
    } else if (!provide.SourcePath.empty()) {
      provide_obj["source-path"] = EncodeFilename(provide.SourcePath);
    }

    provide_obj["is-interface"] = provide.IsInterface;

    provides.append(provide_obj);
  }

  Json::Value& reqs = rule["requires"] = Json::arrayValue;
  for (auto const& require : info.Requires) {
    Json::Value require_obj(Json::objectValue);
    auto const encoded = EncodeFilename(require.LogicalName);
    require_obj["logical-name"] = encoded;
    if (!require.CompiledModulePath.empty()) {
      require_obj["compiled-module-path"] =
        EncodeFilename(require.CompiledModulePath);
    }

    if (require.UseSourcePath) {
      require_obj["unique-on-source-path"] = true;
      require_obj["source-path"] = EncodeFilename(require.SourcePath);
    } else if (!require.SourcePath.empty()) {
      require_obj["source-path"] = EncodeFilename(require.SourcePath);
    }

    const char* lookup_method = nullptr;
    switch (require.Method) {
      case LookupMethod::ByName:
        // No explicit value needed for the default.
        break;
      case LookupMethod::IncludeAngle:
        lookup_method = "include-angle";
        break;
      case LookupMethod::IncludeQuote:
        lookup_method = "include-quote";
        break;
    }
    if (lookup_method) {
      require_obj["lookup-method"] = lookup_method;
    }

    reqs.append(require_obj);
  }

  rules.append(rule);

  cmGeneratedFileStream ddif(path);
  ddif << ddi;

  return !!ddif;
}